

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder__full_decode_and_uninit
                    (ma_decoder *pDecoder,ma_decoder_config *pConfigOut,ma_uint64 *pFrameCountOut,
                    void **ppPCMFramesOut)

{
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ma_uint32 mVar3;
  ma_result mVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  char cVar8;
  ma_uint64 mVar9;
  ma_uint64 mVar10;
  void *pvVar11;
  ulong frameCount;
  ma_uint64 mVar12;
  ma_uint64 framesJustRead;
  ulong local_38;
  
  uVar5 = (ulong)((&DAT_0017d490)[pDecoder->outputFormat] * pDecoder->outputChannels);
  mVar9 = 0;
  mVar12 = 0;
  pvVar11 = (void *)0x0;
  do {
    mVar10 = mVar9;
    pvVar7 = pvVar11;
    if (mVar12 == mVar9) {
      mVar10 = mVar9 * 2;
      if (mVar10 == 0) {
        mVar10 = 0x1000;
      }
      p_Var1 = (pDecoder->allocationCallbacks).onRealloc;
      if (p_Var1 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        pvVar6 = (*p_Var1)(pvVar11,mVar10 * uVar5,(pDecoder->allocationCallbacks).pUserData);
      }
      pvVar7 = pvVar6;
      if (((pvVar6 == (void *)0x0) && (pvVar7 = pvVar11, mVar10 = mVar9, pvVar11 != (void *)0x0)) &&
         (p_Var2 = (pDecoder->allocationCallbacks).onFree,
         p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
        (*p_Var2)(pvVar11,(pDecoder->allocationCallbacks).pUserData);
      }
      if (pvVar6 != (void *)0x0) goto LAB_00151cc9;
      cVar8 = '\x01';
      mVar9 = mVar10;
    }
    else {
LAB_00151cc9:
      frameCount = mVar10 - mVar12;
      mVar4 = ma_decoder_read_pcm_frames
                        (pDecoder,(void *)(mVar12 * uVar5 + (long)pvVar7),frameCount,&local_38);
      mVar12 = mVar12 + local_38;
      cVar8 = '\x02';
      mVar9 = mVar10;
      if (mVar4 == MA_SUCCESS) {
        cVar8 = (local_38 < frameCount) * '\x02';
      }
    }
    pvVar11 = pvVar7;
    if (cVar8 != '\0') {
      if (cVar8 == '\x02') {
        if (pConfigOut != (ma_decoder_config *)0x0) {
          mVar3 = pDecoder->outputChannels;
          pConfigOut->format = pDecoder->outputFormat;
          pConfigOut->channels = mVar3;
          pConfigOut->sampleRate = pDecoder->outputSampleRate;
        }
        if (ppPCMFramesOut == (void **)0x0) {
          if ((pvVar7 != (void *)0x0) &&
             (p_Var2 = (pDecoder->allocationCallbacks).onFree,
             p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
            (*p_Var2)(pvVar7,(pDecoder->allocationCallbacks).pUserData);
          }
        }
        else {
          *ppPCMFramesOut = pvVar7;
        }
        if (pFrameCountOut != (ma_uint64 *)0x0) {
          *pFrameCountOut = mVar12;
        }
        ma_decoder_uninit(pDecoder);
        mVar4 = MA_SUCCESS;
      }
      else {
        mVar4 = MA_OUT_OF_MEMORY;
      }
      return mVar4;
    }
  } while( true );
}

Assistant:

static ma_result ma_decoder__full_decode_and_uninit(ma_decoder* pDecoder, ma_decoder_config* pConfigOut, ma_uint64* pFrameCountOut, void** ppPCMFramesOut)
{
    ma_result result;
    ma_uint64 totalFrameCount;
    ma_uint64 bpf;
    ma_uint64 dataCapInFrames;
    void* pPCMFramesOut;

    MA_ASSERT(pDecoder != NULL);

    totalFrameCount = 0;
    bpf = ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels);

    /* The frame count is unknown until we try reading. Thus, we just run in a loop. */
    dataCapInFrames = 0;
    pPCMFramesOut = NULL;
    for (;;) {
        ma_uint64 frameCountToTryReading;
        ma_uint64 framesJustRead;

        /* Make room if there's not enough. */
        if (totalFrameCount == dataCapInFrames) {
            void* pNewPCMFramesOut;
            ma_uint64 newDataCapInFrames = dataCapInFrames*2;
            if (newDataCapInFrames == 0) {
                newDataCapInFrames = 4096;
            }

            if ((newDataCapInFrames * bpf) > MA_SIZE_MAX) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_TOO_BIG;
            }

            pNewPCMFramesOut = (void*)ma_realloc(pPCMFramesOut, (size_t)(newDataCapInFrames * bpf), &pDecoder->allocationCallbacks);
            if (pNewPCMFramesOut == NULL) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_OUT_OF_MEMORY;
            }

            dataCapInFrames = newDataCapInFrames;
            pPCMFramesOut = pNewPCMFramesOut;
        }

        frameCountToTryReading = dataCapInFrames - totalFrameCount;
        MA_ASSERT(frameCountToTryReading > 0);

        result = ma_decoder_read_pcm_frames(pDecoder, (ma_uint8*)pPCMFramesOut + (totalFrameCount * bpf), frameCountToTryReading, &framesJustRead);
        totalFrameCount += framesJustRead;

        if (result != MA_SUCCESS) {
            break;
        }

        if (framesJustRead < frameCountToTryReading) {
            break;
        }
    }


    if (pConfigOut != NULL) {
        pConfigOut->format     = pDecoder->outputFormat;
        pConfigOut->channels   = pDecoder->outputChannels;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
    }

    if (ppPCMFramesOut != NULL) {
        *ppPCMFramesOut = pPCMFramesOut;
    } else {
        ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
    }

    if (pFrameCountOut != NULL) {
        *pFrameCountOut = totalFrameCount;
    }

    ma_decoder_uninit(pDecoder);
    return MA_SUCCESS;
}